

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

bool __thiscall std::less<Node>::operator()(less<Node> *this,Node *__x,Node *__y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  
  pfVar4 = *(float **)this;
  ppVar5 = __x->p;
  fVar1 = (ppVar5->first).m_s[0];
  fVar2 = *pfVar4;
  if (fVar2 <= fVar1) {
    bVar7 = fVar1 == fVar2;
    bVar6 = bVar7;
    bVar8 = bVar7;
    if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
      fVar3 = (ppVar5->first).m_s[1];
      if (fVar3 < pfVar4[1]) {
        return true;
      }
      bVar8 = fVar3 == pfVar4[1];
      bVar6 = false;
    }
    if ((!bVar6) || ((bool)(fVar1 == fVar2 & bVar8))) {
      if (fVar1 <= fVar2) {
        bVar8 = bVar7;
        if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
          fVar3 = (ppVar5->first).m_s[1];
          if (pfVar4[1] < fVar3) {
            return false;
          }
          bVar7 = pfVar4[1] == fVar3;
          bVar8 = false;
        }
        if ((!bVar8) || ((bool)(fVar1 == fVar2 & bVar7))) {
          return ppVar5->second < (uint)pfVar4[2];
        }
      }
      return false;
    }
  }
  return true;
}

Assistant:

bool operator<(const Node& other) const
            {
                return *p > *other.p;
            }